

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDF::newStream(QPDF *this,string *data)

{
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar1;
  QPDFObjectHandle local_58 [2];
  QPDFObjectHandle local_38;
  undefined1 local_21;
  string *local_20;
  string *data_local;
  QPDF *this_local;
  QPDFObjectHandle *result;
  
  local_21 = 0;
  local_20 = in_RDX;
  data_local = data;
  this_local = this;
  newStream(this);
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData((QPDFObjectHandle *)this,local_20,&local_38,local_58);
  QPDFObjectHandle::~QPDFObjectHandle(local_58);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::newStream(std::string const& data)
{
    auto result = newStream();
    result.replaceStreamData(data, QPDFObjectHandle::newNull(), QPDFObjectHandle::newNull());
    return result;
}